

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

double google::protobuf::internal::NoLocaleStrtod(char *str,char **endptr)

{
  undefined1 auVar1 [8];
  int iVar2;
  LogMessage *pLVar3;
  size_t sVar4;
  char *local_98;
  char *temp_endptr;
  undefined8 local_88;
  char *localized_endptr;
  undefined1 local_70 [8];
  string localized;
  LogFinisher local_31;
  
  temp_endptr = (char *)strtod(str,&local_98);
  if (endptr != (char **)0x0) {
    *endptr = local_98;
  }
  if (*local_98 == '.') {
    iVar2 = snprintf((char *)&local_88,0x10,"%.1f",0x3ff8000000000000);
    if ((char)local_88 != '1') {
      LogMessage::LogMessage
                ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/strutil.cc"
                 ,0x982);
      pLVar3 = LogMessage::operator<<((LogMessage *)local_70,"CHECK failed: (temp[0]) == (\'1\'): ")
      ;
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage((LogMessage *)local_70);
    }
    if (*(char *)((long)&temp_endptr + (long)iVar2 + 7) != '5') {
      LogMessage::LogMessage
                ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/strutil.cc"
                 ,0x983);
      pLVar3 = LogMessage::operator<<
                         ((LogMessage *)local_70,"CHECK failed: (temp[size - 1]) == (\'5\'): ");
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage((LogMessage *)local_70);
    }
    if (6 < iVar2) {
      LogMessage::LogMessage
                ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/strutil.cc"
                 ,0x984);
      pLVar3 = LogMessage::operator<<((LogMessage *)local_70,"CHECK failed: (size) <= (6): ");
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage((LogMessage *)local_70);
    }
    local_70 = (undefined1  [8])&localized._M_string_length;
    localized._M_dataplus._M_p = (pointer)0x0;
    localized._M_string_length._0_1_ = 0;
    strlen(str);
    std::__cxx11::string::reserve((ulong)local_70);
    std::__cxx11::string::replace
              ((ulong)local_70,(ulong)localized._M_dataplus._M_p,(char *)0x0,(ulong)str);
    std::__cxx11::string::append(local_70,(long)&local_88 + 1);
    std::__cxx11::string::append(local_70);
    auVar1 = local_70;
    temp_endptr = (char *)strtod((char *)local_70,(char **)&local_88);
    if ((endptr != (char **)0x0) &&
       ((long)local_98 - (long)str < CONCAT71(local_88._1_7_,(char)local_88) - (long)auVar1)) {
      iVar2 = (int)localized._M_dataplus._M_p;
      sVar4 = strlen(str);
      *endptr = str + (CONCAT71(local_88._1_7_,(char)local_88) -
                      ((long)(iVar2 - (int)sVar4) + (long)auVar1));
    }
    if (local_70 != (undefined1  [8])&localized._M_string_length) {
      operator_delete((void *)local_70);
    }
  }
  return (double)temp_endptr;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char *temp_endptr;
  double result = strtod(str, &temp_endptr);
  if (endptr != NULL) *endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  std::string localized = LocalizeRadix(str, temp_endptr);
  const char *localized_cstr = localized.c_str();
  char *localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) > (temp_endptr - str)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update endptr to point at the right location.
    if (endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(str);
      // const_cast is necessary to match the strtod() interface.
      *endptr = const_cast<char *>(
          str + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}